

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnData::ScanCommittedRange
          (ColumnData *this,idx_t row_group_start,idx_t offset_in_row_group,idx_t s_count,
          Vector *result)

{
  bool bVar1;
  UpdateSegment *in_RCX;
  idx_t in_RDX;
  Vector *in_RSI;
  ColumnScanState *in_RDI;
  idx_t in_R8;
  ColumnData *unaff_retaddr;
  idx_t scan_count;
  bool has_updates;
  ColumnScanState child_state;
  idx_t in_stack_000002a8;
  Vector *in_stack_000002b0;
  pointer in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 local_c0 [136];
  Vector *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd0;
  ColumnScanState *state;
  
  state = in_RDI;
  ColumnScanState::ColumnScanState((ColumnScanState *)in_stack_ffffffffffffff00);
  (*(code *)in_RDI->current->type_size)(in_RDI,local_c0,&in_RSI->vector_type + in_RDX);
  bVar1 = HasUpdates((ColumnData *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  ScanVector(unaff_retaddr,state,in_RSI,in_RDX,(ScanVectorType)((ulong)in_RCX >> 0x20),in_R8);
  if (bVar1) {
    Vector::Flatten(in_stack_000002b0,in_stack_000002a8);
    in_stack_ffffffffffffff00 =
         unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
         operator->((unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>
                     *)in_stack_ffffffffffffff00);
    UpdateSegment::FetchCommittedRange
              (in_RCX,in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  ColumnScanState::~ColumnScanState((ColumnScanState *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void ColumnData::ScanCommittedRange(idx_t row_group_start, idx_t offset_in_row_group, idx_t s_count, Vector &result) {
	ColumnScanState child_state;
	InitializeScanWithOffset(child_state, row_group_start + offset_in_row_group);
	bool has_updates = HasUpdates();
	auto scan_count = ScanVector(child_state, result, s_count, ScanVectorType::SCAN_FLAT_VECTOR);
	if (has_updates) {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		result.Flatten(scan_count);
		updates->FetchCommittedRange(offset_in_row_group, s_count, result);
	}
}